

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::PhiInst::deep_copy(PhiInst *this)

{
  Inst *this_00;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_RDI;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *unaff_retaddr;
  VarId *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffc4;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_stack_ffffffffffffffe0;
  VarId *in_stack_ffffffffffffffe8;
  PhiInst *in_stack_fffffffffffffff0;
  
  this_00 = (Inst *)operator_new(0x40);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  VarId::VarId((VarId *)this_00,in_stack_ffffffffffffffa8);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(unaff_retaddr,in_RDI);
  PhiInst(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             (CONCAT44(in_stack_ffffffffffffffc4,uVar1) & 0xffffffff00ffffff));
  return this_00;
}

Assistant:

Inst* deep_copy() { return new PhiInst(dest, vars); }